

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O3

size_t __thiscall serial::Serial::readline(Serial *this,string *buffer,size_t size,string *eol)

{
  long lVar1;
  SerialImpl *pSVar2;
  pointer __s2;
  long lVar3;
  long *__s1;
  size_t __n;
  int iVar4;
  ssize_t sVar5;
  string *psVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  bool bVar10;
  undefined8 uStack_80;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  Serial *local_58;
  long local_50;
  size_t local_48;
  string *local_40;
  SerialImpl *local_38;
  
  local_38 = this->pimpl_;
  uStack_80 = 0x1076ee;
  psVar6 = eol;
  local_58 = this;
  local_40 = buffer;
  SerialImpl::readLock(local_38);
  sVar9 = 0;
  local_50 = -eol->_M_string_length;
  lVar3 = -(size + 0xf & 0xfffffffffffffff0);
  uVar7 = (long)&local_78 + lVar3;
  local_48 = size;
  do {
    pSVar2 = local_58->pimpl_;
    *(undefined8 *)((long)&uStack_80 + lVar3) = 0x107727;
    sVar5 = SerialImpl::read(pSVar2,(int)uVar7 + (int)sVar9,(void *)0x1,(size_t)psVar6);
    sVar9 = sVar9 + sVar5;
    if (sVar5 == 0) break;
    lVar1 = uVar7 + sVar9 + local_50;
    local_78 = local_68;
    *(undefined8 *)((long)&uStack_80 + lVar3) = 0x10774c;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,lVar1);
    __n = local_70;
    __s1 = local_78;
    if (local_70 == eol->_M_string_length) {
      if (local_70 == 0) {
        bVar10 = true;
      }
      else {
        __s2 = (eol->_M_dataplus)._M_p;
        *(undefined8 *)((long)&uStack_80 + lVar3) = 0x10776c;
        iVar4 = bcmp(__s1,__s2,__n);
        bVar10 = iVar4 == 0;
      }
    }
    else {
      bVar10 = false;
    }
    if (__s1 != local_68) {
      uVar8 = local_68[0] + 1;
      *(undefined8 *)((long)&uStack_80 + lVar3) = 0x107798;
      operator_delete(__s1,uVar8);
    }
  } while (sVar9 != local_48 && !bVar10);
  psVar6 = local_40;
  *(undefined8 *)((long)&uStack_80 + lVar3) = 0x1077b7;
  std::__cxx11::string::append((char *)psVar6,uVar7);
  pSVar2 = local_38;
  *(undefined8 *)((long)&uStack_80 + lVar3) = 0x1077c0;
  SerialImpl::readUnlock(pSVar2);
  return sVar9;
}

Assistant:

size_t
Serial::readline (string &buffer, size_t size, string eol)
{
  ScopedReadLock lock(this->pimpl_);
  size_t eol_len = eol.length ();
  uint8_t *buffer_ = static_cast<uint8_t*>
                              (alloca (size * sizeof (uint8_t)));
  size_t read_so_far = 0;
  while (true)
  {
    size_t bytes_read = this->read_ (buffer_ + read_so_far, 1);
    read_so_far += bytes_read;
    if (bytes_read == 0) {
      break; // Timeout occured on reading 1 byte
    }
    if (string (reinterpret_cast<const char*>
         (buffer_ + read_so_far - eol_len), eol_len) == eol) {
      break; // EOL found
    }
    if (read_so_far == size) {
      break; // Reached the maximum read length
    }
  }
  buffer.append(reinterpret_cast<const char*> (buffer_), read_so_far);
  return read_so_far;
}